

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O3

void __thiscall ProfileHandler::~ProfileHandler(ProfileHandler *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  Reset(this);
  if (this->per_thread_timer_enabled_ == true) {
    pthread_key_delete(this->thread_timer_key);
  }
  p_Var2 = (this->callbacks_).
           super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->callbacks_) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

ProfileHandler::~ProfileHandler() {
  Reset();
#if HAVE_LINUX_SIGEV_THREAD_ID
  if (per_thread_timer_enabled_) {
    pthread_key_delete(thread_timer_key);
  }
#endif
}